

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O2

int hex_digit_to_int(uchar ch)

{
  int iVar1;
  
  if ((byte)(ch - 0x30) < 10) {
    iVar1 = -0x30;
  }
  else if ((byte)(ch + 0x9f) < 6) {
    iVar1 = -0x57;
  }
  else {
    if (5 < (byte)(ch + 0xbf)) {
      __assert_fail("(\"unknown error\", false)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/BUAA-SE-Compiling[P]c0-vm-cpp/src/./././util/util.hpp"
                    ,0x1c,"int hex_digit_to_int(unsigned char)");
    }
    iVar1 = -0x37;
  }
  return (uint)ch + iVar1;
}

Assistant:

inline int hex_digit_to_int(unsigned char ch) {
    if ('0' <= ch && ch <= '9') {
        return ch - '0';
    }
    if ('a' <= ch && ch <= 'f') {
        return ch - 'a' + 10;
    }
    if ('A' <= ch && ch <= 'F') {
        return ch - 'A' + 10;
    }
    assert(("unknown error", false));
    return -1;
}